

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::multipredict<false,false>
               (gd *g,base_learner *param_2,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  vw *all;
  vw *pvVar1;
  polyprediction *ppVar2;
  size_t sVar3;
  float fVar4;
  multipredict_info<sparse_parameters> local_40;
  
  all = g->all;
  ppVar2 = pred;
  sVar3 = count;
  if (count != 0) {
    do {
      ppVar2->scalar = (ec->l).simple.initial;
      sVar3 = sVar3 - 1;
      ppVar2 = ppVar2 + 1;
    } while (sVar3 != 0);
  }
  pvVar1 = g->all;
  local_40.count = count;
  local_40.step = step;
  local_40.pred = pred;
  if ((pvVar1->weights).sparse == false) {
    local_40.weights = (sparse_parameters *)&(pvVar1->weights).dense_weights;
    local_40.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_40);
  }
  else {
    local_40.weights = &(pvVar1->weights).sparse_weights;
    local_40.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_multipredict>
              (all,ec,&local_40);
  }
  ppVar2 = pred;
  sVar3 = count;
  if (count != 0 && all->sd->contraction != 1.0) {
    do {
      ppVar2->scalar = (float)all->sd->contraction * ppVar2->scalar;
      sVar3 = sVar3 - 1;
      ppVar2 = ppVar2 + 1;
    } while (sVar3 != 0);
  }
  if (finalize_predictions && count != 0) {
    do {
      fVar4 = finalize_prediction(all->sd,pred->scalar);
      pred->scalar = fVar4;
      pred = pred + 1;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

void multipredict(
    gd& g, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *g.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (g.all->weights.sparse)
  {
    multipredict_info<sparse_parameters> mp = {
        count, step, pred, g.all->weights.sparse_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    multipredict_info<dense_parameters> mp = {count, step, pred, g.all->weights.dense_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}